

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psbt.h
# Opt level: O3

void __thiscall PSBTOutput::Unserialize<DataStream>(PSBTOutput *this,DataStream *s)

{
  pointer pbVar1;
  size_type sVar2;
  pointer puVar3;
  pointer puVar4;
  bool bVar5;
  uint64_t uVar6;
  const_iterator cVar7;
  const_iterator cVar8;
  pointer pbVar9;
  char *pcVar10;
  long lVar11;
  PSBTOutput *v;
  _Base_ptr p_Var12;
  undefined1 auVar13 [8];
  pointer pbVar14;
  long in_FS_OFFSET;
  Span<const_unsigned_char> script;
  pair<std::_Rb_tree_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_bool>
  pVar15;
  uint8_t obj;
  uint8_t leaf_ver;
  uint8_t depth;
  SpanReader skey;
  vector<unsigned_char,_std::allocator<unsigned_char>_> key;
  SpanReader s_tree;
  set<uint256,_std::less<uint256>,_std::allocator<uint256>_> leaf_hashes;
  XOnlyPubKey xonly;
  PSBTProprietary this_prop;
  set<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  key_lookup;
  undefined4 local_190 [2];
  undefined8 local_188;
  byte local_17a;
  byte local_179;
  SpanReader local_178;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_168;
  KeyOriginInfo local_148;
  undefined1 local_128 [8];
  pointer puStack_120;
  _Base_ptr local_118;
  _Base_ptr local_110;
  _Base_ptr local_108;
  size_t local_100;
  undefined1 local_f8 [8];
  pointer puStack_f0;
  pointer local_e8;
  uchar auStack_e0 [8];
  pointer local_d8;
  vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
  vStack_d0;
  undefined1 auStack_b8 [16];
  pointer puStack_a8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_a0;
  uchar auStack_88 [32];
  _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::_Identity<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_68._M_impl.super__Rb_tree_header._M_header._M_left =
       &local_68._M_impl.super__Rb_tree_header._M_header;
  local_68._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_68._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_68._M_impl.super__Rb_tree_header._M_node_count = 0;
  bVar5 = false;
  local_68._M_impl.super__Rb_tree_header._M_header._M_right =
       local_68._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((long)(s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_finish -
        (long)(s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl.
              super__Vector_impl_data._M_start == s->m_read_pos) break;
    local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    DataStream::operator>>(s,&local_168);
    puVar4 = local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    puVar3 = local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
             super__Vector_impl_data._M_start;
    if (local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start ==
        local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      bVar5 = true;
      goto LAB_007e8610;
    }
    local_178.m_data.m_size =
         (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish -
         (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start;
    local_178.m_data.m_data =
         local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    uVar6 = ReadCompactSize<SpanReader>(&local_178,true);
    switch(uVar6) {
    case 0:
      pVar15 = std::
               _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               ::_M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                         ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           *)&local_68,&local_168);
      if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pcVar10 = (char *)__cxa_allocate_exception(0x20);
        vStack_d0.
        super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_d8 = (pointer)CONCAT44(local_d8._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar10,(error_code *)"Duplicate Key, output redeemScript already provided");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar10,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
      }
      else {
        v = this;
        if ((long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish -
            (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_start == 1) goto LAB_007e83f6;
        pcVar10 = (char *)__cxa_allocate_exception(0x20);
        vStack_d0.
        super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_d8 = (pointer)CONCAT44(local_d8._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar10,(error_code *)"Output redeemScript key is more than one byte type");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar10,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
      }
      goto LAB_007e9071;
    case 1:
      pVar15 = std::
               _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               ::_M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                         ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           *)&local_68,&local_168);
      if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pcVar10 = (char *)__cxa_allocate_exception(0x20);
        vStack_d0.
        super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_d8 = (pointer)CONCAT44(local_d8._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar10,(error_code *)"Duplicate Key, output witnessScript already provided");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar10,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_007e9071;
      }
      v = (PSBTOutput *)&this->witness_script;
      if ((long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != 1) {
        pcVar10 = (char *)__cxa_allocate_exception(0x20);
        vStack_d0.
        super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_d8 = (pointer)CONCAT44(local_d8._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar10,(error_code *)"Output witnessScript key is more than one byte type");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar10,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_007e9071;
      }
LAB_007e83f6:
      Unserialize<DataStream,28u,unsigned_char>
                (s,(prevector<28U,_unsigned_char,_unsigned_int,_int> *)v);
      break;
    case 2:
      DeserializeHDKeypaths<DataStream>(s,&local_168,&this->hd_keypaths);
      break;
    case 3:
    case 4:
switchD_007e7fdf_caseD_3:
      cVar8 = std::
              _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::_Select1st<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::pair<const_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>_>
              ::find(&(this->unknown)._M_t,&local_168);
      if ((_Rb_tree_header *)cVar8._M_node == &(this->unknown)._M_t._M_impl.super__Rb_tree_header) {
        local_d8 = (pointer)0x0;
        vStack_d0.
        super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        vStack_d0.
        super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        DataStream::operator>>(s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d8)
        ;
        std::
        _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
        ::
        _M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                  ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::_Select1st<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::pair<std::vector<unsigned_char,std::allocator<unsigned_char>>const,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                    *)&this->unknown,&local_168,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_d8);
        auVar13 = (undefined1  [8])local_d8;
        p_Var12 = (_Base_ptr)
                  vStack_d0.
                  super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        goto joined_r0x007e85f6;
      }
      pcVar10 = (char *)__cxa_allocate_exception(0x20);
      vStack_d0.
      super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)std::iostream_category();
      local_d8 = (pointer)CONCAT44(local_d8._4_4_,1);
      std::ios_base::failure[abi:cxx11]::failure
                (pcVar10,(error_code *)"Duplicate Key, key for unknown value already provided");
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pcVar10,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
      goto LAB_007e9071;
    case 5:
      pVar15 = std::
               _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               ::_M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                         ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           *)&local_68,&local_168);
      if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pcVar10 = (char *)__cxa_allocate_exception(0x20);
        vStack_d0.
        super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_d8 = (pointer)CONCAT44(local_d8._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar10,(error_code *)
                           "Duplicate Key, output Taproot internal key already provided");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar10,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_007e9071;
      }
      if ((long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != 1) {
        pcVar10 = (char *)__cxa_allocate_exception(0x20);
        vStack_d0.
        super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_d8 = (pointer)CONCAT44(local_d8._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar10,(error_code *)
                           "Output Taproot internal key key is more than one byte type");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar10,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_007e9071;
      }
      UnserializeFromVector<DataStream,XOnlyPubKey&>(s,&this->m_tap_internal_key);
      break;
    case 6:
      pVar15 = std::
               _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               ::_M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                         ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           *)&local_68,&local_168);
      if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pcVar10 = (char *)__cxa_allocate_exception(0x20);
        vStack_d0.
        super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_d8 = (pointer)CONCAT44(local_d8._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar10,(error_code *)"Duplicate Key, output Taproot tree already provided");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar10,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_007e9071;
      }
      if ((long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != 1) {
        pcVar10 = (char *)__cxa_allocate_exception(0x20);
        vStack_d0.
        super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_d8 = (pointer)CONCAT44(local_d8._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar10,(error_code *)"Output Taproot tree key is more than one byte type");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar10,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_007e9071;
      }
      local_128 = (undefined1  [8])0x0;
      puStack_120 = (pointer)0x0;
      local_118 = (_Base_ptr)0x0;
      DataStream::operator>>(s,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_128);
      local_148.fingerprint[0] = local_128[0];
      local_148.fingerprint[1] = local_128[1];
      local_148.fingerprint[2] = local_128[2];
      local_148.fingerprint[3] = local_128[3];
      local_148._4_4_ = local_128._4_4_;
      script.m_size = (pointer)(puStack_120 + -(long)local_128);
      local_148.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = script.m_size;
      if (script.m_size == (pointer)0x0) {
        pcVar10 = (char *)__cxa_allocate_exception(0x20);
        vStack_d0.
        super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_d8 = (pointer)CONCAT44(local_d8._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar10,(error_code *)"Output Taproot tree must not be empty");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar10,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_007e9071;
      }
      local_d8 = (pointer)CONCAT71(local_d8._1_7_,1);
      local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      auStack_88[0] = '\0';
      auStack_88[1] = '\0';
      auStack_88[2] = '\0';
      auStack_88[3] = '\0';
      auStack_88[4] = '\0';
      auStack_88[5] = '\0';
      auStack_88[6] = '\0';
      auStack_88[7] = '\0';
      local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      auStack_b8._8_8_ = (pointer)0x0;
      puStack_a8 = (pointer)0x0;
      vStack_d0.
      super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      auStack_b8._0_8_ = (pointer)0x0;
      vStack_d0.
      super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_d0.
      super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      auStack_88[8] = '\0';
      auStack_88[9] = '\0';
      auStack_88[10] = '\0';
      auStack_88[0xb] = '\0';
      auStack_88[0xc] = '\0';
      auStack_88[0xd] = '\0';
      auStack_88[0xe] = '\0';
      auStack_88[0xf] = '\0';
      do {
        local_f8 = (undefined1  [8])0x0;
        puStack_f0 = (pointer)0x0;
        local_e8 = (pointer)0x0;
        SpanReader::read((SpanReader *)&local_148,(int)local_190,(void *)0x1,(size_t)script.m_size);
        local_179 = (byte)local_190[0];
        SpanReader::read((SpanReader *)&local_148,(int)local_190,(void *)0x1,(size_t)script.m_size);
        local_17a = (byte)local_190[0];
        SpanReader::operator>>
                  ((SpanReader *)&local_148,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8);
        if (0x80 < local_179) {
          pcVar10 = (char *)__cxa_allocate_exception(0x20);
          local_188 = std::iostream_category();
          local_190[0] = 1;
          std::ios_base::failure[abi:cxx11]::failure
                    (pcVar10,(error_code *)
                             "Output Taproot tree has as leaf greater than Taproot maximum depth");
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(pcVar10,&std::ios_base::failure[abi:cxx11]::typeinfo,
                        std::ios_base::failure[abi:cxx11]::~failure);
          }
          goto LAB_007e9071;
        }
        if ((local_17a & 1) != 0) {
          pcVar10 = (char *)__cxa_allocate_exception(0x20);
          local_188 = std::iostream_category();
          local_190[0] = 1;
          std::ios_base::failure[abi:cxx11]::failure
                    (pcVar10,(error_code *)
                             "Output Taproot tree has a leaf with an invalid leaf version");
          if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
            __cxa_throw(pcVar10,&std::ios_base::failure[abi:cxx11]::typeinfo,
                        std::ios_base::failure[abi:cxx11]::~failure);
          }
          goto LAB_007e9071;
        }
        std::
        vector<std::tuple<unsigned_char,unsigned_char,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::tuple<unsigned_char,unsigned_char,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
        ::
        emplace_back<unsigned_char&,unsigned_char&,std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                  ((vector<std::tuple<unsigned_char,unsigned_char,std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::tuple<unsigned_char,unsigned_char,std::vector<unsigned_char,std::allocator<unsigned_char>>>>>
                    *)&this->m_tap_tree,&local_179,&local_17a,
                   (vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_f8);
        script.m_size = (pointer)(puStack_f0 + -(long)local_f8);
        script.m_data = (uchar *)local_f8;
        TaprootBuilder::Add((TaprootBuilder *)&local_d8,(uint)local_179,script,(uint)local_17a,true)
        ;
        if (local_f8 != (undefined1  [8])0x0) {
          operator_delete((void *)local_f8,(long)local_e8 - (long)local_f8);
        }
      } while (local_148.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
               _M_impl.super__Vector_impl_data._M_start != (pointer)0x0);
      if ((((ulong)local_d8 & 1) == 0) ||
         ((lVar11 = (long)vStack_d0.
                          super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                          ._M_impl.super__Vector_impl_data._M_finish -
                    (long)vStack_d0.
                          super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                          ._M_impl.super__Vector_impl_data._M_start >> 6, lVar11 != 0 &&
          ((lVar11 != 1 ||
           (((vStack_d0.
              super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
            super__Optional_base<TaprootBuilder::NodeInfo,_false,_false>)._M_payload.
            super__Optional_payload<TaprootBuilder::NodeInfo,_true,_false,_false>.
            super__Optional_payload_base<TaprootBuilder::NodeInfo>._M_engaged == false)))))) {
        pcVar10 = (char *)__cxa_allocate_exception(0x20);
        puStack_f0 = (pointer)std::iostream_category();
        local_f8._0_4_ = 1;
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar10,(error_code *)"Output Taproot tree is malformed");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar10,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_007e9071;
      }
      std::
      vector<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
      ::~vector(&vStack_d0);
      auVar13 = local_128;
      p_Var12 = local_118;
joined_r0x007e85f6:
      if (auVar13 != (undefined1  [8])0x0) {
LAB_007e8600:
        operator_delete((void *)auVar13,(long)p_Var12 - (long)auVar13);
      }
      break;
    case 7:
      pVar15 = std::
               _Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
               ::_M_emplace_unique<std::vector<unsigned_char,std::allocator<unsigned_char>>&>
                         ((_Rb_tree<std::vector<unsigned_char,std::allocator<unsigned_char>>,std::vector<unsigned_char,std::allocator<unsigned_char>>,std::_Identity<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::less<std::vector<unsigned_char,std::allocator<unsigned_char>>>,std::allocator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                           *)&local_68,&local_168);
      if (((undefined1  [16])pVar15 & (undefined1  [16])0x1) == (undefined1  [16])0x0) {
        pcVar10 = (char *)__cxa_allocate_exception(0x20);
        vStack_d0.
        super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_d8 = (pointer)CONCAT44(local_d8._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar10,(error_code *)
                           "Duplicate Key, output Taproot BIP32 keypath already provided");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar10,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_007e9071;
      }
      if ((long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start != 0x21) {
        pcVar10 = (char *)__cxa_allocate_exception(0x20);
        vStack_d0.
        super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_d8 = (pointer)CONCAT44(local_d8._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar10,(error_code *)"Output Taproot BIP32 keypath key is not at 33 bytes");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar10,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_007e9071;
      }
      local_f8 = *(undefined1 (*) [8])
                  (local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start + 1);
      puStack_f0 = *(pointer *)
                    (local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start + 9);
      local_e8 = *(pointer *)
                  (local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start + 0x11);
      auStack_e0 = *(uchar (*) [8])
                    (local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start + 0x19);
      puStack_120 = (pointer)((ulong)puStack_120 & 0xffffffff00000000);
      local_118 = (_Base_ptr)0x0;
      local_110 = (_Base_ptr)&puStack_120;
      local_100 = 0;
      local_108 = local_110;
      pbVar9 = (pointer)ReadCompactSize<DataStream>(s,true);
      pbVar1 = (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>._M_impl
               .super__Vector_impl_data._M_start;
      pbVar14 = (s->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
                _M_impl.super__Vector_impl_data._M_finish;
      sVar2 = s->m_read_pos;
      Unserialize<DataStream,uint256,std::less<uint256>,std::allocator<uint256>>
                (s,(set<uint256,_std::less<uint256>,_std::allocator<uint256>_> *)local_128);
      pbVar14 = pbVar14 + (long)((s->vch).
                                 super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                 ._M_impl.super__Vector_impl_data._M_start +
                                (s->m_read_pos -
                                (long)((s->vch).
                                       super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>
                                       ._M_impl.super__Vector_impl_data._M_finish +
                                      (long)(pbVar1 + sVar2))));
      if (pbVar9 < pbVar14) {
        pcVar10 = (char *)__cxa_allocate_exception(0x20);
        vStack_d0.
        super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)std::iostream_category();
        local_d8 = (pointer)CONCAT44(local_d8._4_4_,1);
        std::ios_base::failure[abi:cxx11]::failure
                  (pcVar10,(error_code *)"Output Taproot BIP32 keypath has an invalid length");
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          __cxa_throw(pcVar10,&std::ios_base::failure[abi:cxx11]::typeinfo,
                      std::ios_base::failure[abi:cxx11]::~failure);
        }
        goto LAB_007e9071;
      }
      DeserializeKeyOrigin<DataStream>(&local_148,s,(long)pbVar9 - (long)pbVar14);
      std::
      _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
      ::_Rb_tree((_Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
                  *)&local_d8,
                 (_Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
                  *)local_128);
      puStack_a8 = (pointer)CONCAT44(puStack_a8._4_4_,local_148.fingerprint);
      local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)local_148.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start;
      local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish =
           (pointer)local_148.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
      local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage =
           (pointer)local_148.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
      local_148.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_148.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_148.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::
      _Rb_tree<XOnlyPubKey,std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>,std::_Select1st<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>>
      ::
      _M_emplace_unique<XOnlyPubKey&,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>
                ((_Rb_tree<XOnlyPubKey,std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>,std::_Select1st<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>,std::less<XOnlyPubKey>,std::allocator<std::pair<XOnlyPubKey_const,std::pair<std::set<uint256,std::less<uint256>,std::allocator<uint256>>,KeyOriginInfo>>>>
                  *)&this->m_tap_bip32_paths,(XOnlyPubKey *)local_f8,
                 (pair<std::set<uint256,_std::less<uint256>,_std::allocator<uint256>_>,_KeyOriginInfo>
                  *)&local_d8);
      if ((pointer)local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                   _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_a0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_a0.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
      ::~_Rb_tree((_Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
                   *)&local_d8);
      if (local_148.path.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_148.path.
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                        super__Vector_impl_data._M_start,
                        (long)local_148.path.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_148.path.
                              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      std::
      _Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
      ::~_Rb_tree((_Rb_tree<uint256,_uint256,_std::_Identity<uint256>,_std::less<uint256>,_std::allocator<uint256>_>
                   *)local_128);
      break;
    default:
      if (uVar6 != 0xfc) goto switchD_007e7fdf_caseD_3;
      local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      auStack_b8._8_8_ = (pointer)0x0;
      puStack_a8 = (pointer)0x0;
      vStack_d0.
      super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      auStack_b8._0_8_ = (pointer)0x0;
      vStack_d0.
      super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      vStack_d0.
      super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      SpanReader::operator>>
                (&local_178,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&vStack_d0);
      local_d8 = (pointer)ReadCompactSize<SpanReader>(&local_178,true);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)auStack_b8,&local_168);
      cVar7 = std::
              _Rb_tree<PSBTProprietary,_PSBTProprietary,_std::_Identity<PSBTProprietary>,_std::less<PSBTProprietary>,_std::allocator<PSBTProprietary>_>
              ::find(&(this->m_proprietary)._M_t,(key_type *)&local_d8);
      if ((_Rb_tree_header *)cVar7._M_node ==
          &(this->m_proprietary)._M_t._M_impl.super__Rb_tree_header) {
        DataStream::operator>>(s,&local_a0);
        std::
        _Rb_tree<PSBTProprietary,PSBTProprietary,std::_Identity<PSBTProprietary>,std::less<PSBTProprietary>,std::allocator<PSBTProprietary>>
        ::_M_insert_unique<PSBTProprietary_const&>
                  ((_Rb_tree<PSBTProprietary,PSBTProprietary,std::_Identity<PSBTProprietary>,std::less<PSBTProprietary>,std::allocator<PSBTProprietary>>
                    *)&this->m_proprietary,(PSBTProprietary *)&local_d8);
        if ((pointer)local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          operator_delete(local_a0.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_start,
                          (long)local_a0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage -
                          (long)local_a0.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_start);
        }
        if ((pointer)auStack_b8._0_8_ != (pointer)0x0) {
          operator_delete((void *)auStack_b8._0_8_,(long)puStack_a8 - auStack_b8._0_8_);
        }
        p_Var12 = (_Base_ptr)
                  vStack_d0.
                  super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
        auVar13 = (undefined1  [8])
                  vStack_d0.
                  super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        if (vStack_d0.
            super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
            ._M_impl.super__Vector_impl_data._M_start == (pointer)0x0) break;
        goto LAB_007e8600;
      }
      pcVar10 = (char *)__cxa_allocate_exception(0x20);
      puStack_120 = (pointer)std::iostream_category();
      local_128._0_4_ = 1;
      std::ios_base::failure[abi:cxx11]::failure
                (pcVar10,(error_code *)"Duplicate Key, proprietary key already found");
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        __cxa_throw(pcVar10,&std::ios_base::failure[abi:cxx11]::typeinfo,
                    std::ios_base::failure[abi:cxx11]::~failure);
      }
      goto LAB_007e9071;
    }
LAB_007e8610:
    if (local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_168.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_168.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_168.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
  } while (puVar3 != puVar4);
  if (bVar5) {
    std::
    _Rb_tree<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::_Identity<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::less<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
    ::~_Rb_tree(&local_68);
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else {
    pcVar10 = (char *)__cxa_allocate_exception(0x20);
    vStack_d0.
    super__Vector_base<std::optional<TaprootBuilder::NodeInfo>,_std::allocator<std::optional<TaprootBuilder::NodeInfo>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)std::iostream_category();
    local_d8 = (pointer)CONCAT44(local_d8._4_4_,1);
    std::ios_base::failure[abi:cxx11]::failure
              (pcVar10,(error_code *)"Separator is missing at the end of an output map");
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      __cxa_throw(pcVar10,&std::ios_base::failure[abi:cxx11]::typeinfo,
                  std::ios_base::failure[abi:cxx11]::~failure);
    }
  }
LAB_007e9071:
  __stack_chk_fail();
}

Assistant:

inline void Unserialize(Stream& s) {
        // Used for duplicate key detection
        std::set<std::vector<unsigned char>> key_lookup;

        // Read loop
        bool found_sep = false;
        while(!s.empty()) {
            // Read
            std::vector<unsigned char> key;
            s >> key;

            // the key is empty if that was actually a separator byte
            // This is a special case for key lengths 0 as those are not allowed (except for separator)
            if (key.empty()) {
                found_sep = true;
                break;
            }

            // Type is compact size uint at beginning of key
            SpanReader skey{key};
            uint64_t type = ReadCompactSize(skey);

            // Do stuff based on type
            switch(type) {
                case PSBT_OUT_REDEEMSCRIPT:
                {
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, output redeemScript already provided");
                    } else if (key.size() != 1) {
                        throw std::ios_base::failure("Output redeemScript key is more than one byte type");
                    }
                    s >> redeem_script;
                    break;
                }
                case PSBT_OUT_WITNESSSCRIPT:
                {
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, output witnessScript already provided");
                    } else if (key.size() != 1) {
                        throw std::ios_base::failure("Output witnessScript key is more than one byte type");
                    }
                    s >> witness_script;
                    break;
                }
                case PSBT_OUT_BIP32_DERIVATION:
                {
                    DeserializeHDKeypaths(s, key, hd_keypaths);
                    break;
                }
                case PSBT_OUT_TAP_INTERNAL_KEY:
                {
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, output Taproot internal key already provided");
                    } else if (key.size() != 1) {
                        throw std::ios_base::failure("Output Taproot internal key key is more than one byte type");
                    }
                    UnserializeFromVector(s, m_tap_internal_key);
                    break;
                }
                case PSBT_OUT_TAP_TREE:
                {
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, output Taproot tree already provided");
                    } else if (key.size() != 1) {
                        throw std::ios_base::failure("Output Taproot tree key is more than one byte type");
                    }
                    std::vector<unsigned char> tree_v;
                    s >> tree_v;
                    SpanReader s_tree{tree_v};
                    if (s_tree.empty()) {
                        throw std::ios_base::failure("Output Taproot tree must not be empty");
                    }
                    TaprootBuilder builder;
                    while (!s_tree.empty()) {
                        uint8_t depth;
                        uint8_t leaf_ver;
                        std::vector<unsigned char> script;
                        s_tree >> depth;
                        s_tree >> leaf_ver;
                        s_tree >> script;
                        if (depth > TAPROOT_CONTROL_MAX_NODE_COUNT) {
                            throw std::ios_base::failure("Output Taproot tree has as leaf greater than Taproot maximum depth");
                        }
                        if ((leaf_ver & ~TAPROOT_LEAF_MASK) != 0) {
                            throw std::ios_base::failure("Output Taproot tree has a leaf with an invalid leaf version");
                        }
                        m_tap_tree.emplace_back(depth, leaf_ver, script);
                        builder.Add((int)depth, script, (int)leaf_ver, /*track=*/true);
                    }
                    if (!builder.IsComplete()) {
                        throw std::ios_base::failure("Output Taproot tree is malformed");
                    }
                    break;
                }
                case PSBT_OUT_TAP_BIP32_DERIVATION:
                {
                    if (!key_lookup.emplace(key).second) {
                        throw std::ios_base::failure("Duplicate Key, output Taproot BIP32 keypath already provided");
                    } else if (key.size() != 33) {
                        throw std::ios_base::failure("Output Taproot BIP32 keypath key is not at 33 bytes");
                    }
                    XOnlyPubKey xonly(uint256(Span<uint8_t>(key).last(32)));
                    std::set<uint256> leaf_hashes;
                    uint64_t value_len = ReadCompactSize(s);
                    size_t before_hashes = s.size();
                    s >> leaf_hashes;
                    size_t after_hashes = s.size();
                    size_t hashes_len = before_hashes - after_hashes;
                    if (hashes_len > value_len) {
                        throw std::ios_base::failure("Output Taproot BIP32 keypath has an invalid length");
                    }
                    size_t origin_len = value_len - hashes_len;
                    m_tap_bip32_paths.emplace(xonly, std::make_pair(leaf_hashes, DeserializeKeyOrigin(s, origin_len)));
                    break;
                }
                case PSBT_OUT_PROPRIETARY:
                {
                    PSBTProprietary this_prop;
                    skey >> this_prop.identifier;
                    this_prop.subtype = ReadCompactSize(skey);
                    this_prop.key = key;

                    if (m_proprietary.count(this_prop) > 0) {
                        throw std::ios_base::failure("Duplicate Key, proprietary key already found");
                    }
                    s >> this_prop.value;
                    m_proprietary.insert(this_prop);
                    break;
                }
                // Unknown stuff
                default: {
                    if (unknown.count(key) > 0) {
                        throw std::ios_base::failure("Duplicate Key, key for unknown value already provided");
                    }
                    // Read in the value
                    std::vector<unsigned char> val_bytes;
                    s >> val_bytes;
                    unknown.emplace(std::move(key), std::move(val_bytes));
                    break;
                }
            }
        }

        if (!found_sep) {
            throw std::ios_base::failure("Separator is missing at the end of an output map");
        }
    }